

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O2

Vec_Bit_t * Pla_GenRandom(int nVars,int nNums,int fNonZero)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  Vec_Bit_t *p;
  int iVar4;
  int iVar5;
  int nCap;
  
  iVar5 = 1 << ((byte)nVars & 0x1f);
  iVar4 = (iVar5 >> 5) + (uint)((uint)nVars < 5);
  nCap = iVar4 * 0x20;
  p = Vec_BitAlloc(nCap);
  p->nSize = nCap;
  memset(p->pArray,0,(long)iVar4 << 2);
  if (0x1d < nVars - 1U) {
    __assert_fail("nVars > 0 && nVars <= 30",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaMan.c"
                  ,0x9a,"Vec_Bit_t *Pla_GenRandom(int, int, int)");
  }
  bVar1 = (byte)(nVars - 1U) & 0x1f;
  if ((0 < nNums) && ((uint)nNums >> bVar1 == 0)) {
    for (uVar2 = 0 >> bVar1; uVar2 != nNums; uVar2 = uVar2 + 1) {
      do {
        do {
          uVar3 = Gia_ManRandom(0);
          uVar3 = uVar3 & iVar5 - 1U;
        } while (fNonZero != 0 && uVar3 == 0);
        iVar4 = Vec_BitEntry(p,uVar3);
      } while (iVar4 != 0);
      Vec_BitWriteEntry(p,uVar3,1);
    }
    return p;
  }
  __assert_fail("nNums > 0 && nNums < (1 << (nVars - 1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaMan.c"
                ,0x9b,"Vec_Bit_t *Pla_GenRandom(int, int, int)");
}

Assistant:

Vec_Bit_t * Pla_GenRandom( int nVars, int nNums, int fNonZero )
{
    int Mint, Count = 0;
    Vec_Bit_t * vBits = Vec_BitStart( 1 << nVars );
    assert( nVars > 0 && nVars <= 30 );
    assert( nNums > 0 && nNums < (1 << (nVars - 1)) );
    while ( Count < nNums )
    {
        Mint = Gia_ManRandom(0) & ((1 << nVars) - 1);
        if ( fNonZero && Mint == 0 )
            continue;
        if ( Vec_BitEntry(vBits, Mint) )
            continue;
        Vec_BitWriteEntry( vBits, Mint, 1 );
        Count++;
    }
    return vBits;
}